

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O2

void __thiscall sznet::net::Acceptor::handleRead(Acceptor *this)

{
  int iVar1;
  socklen_t *__addr_len;
  sockaddr *__addr;
  SourceFile file;
  Logger local_1018;
  undefined1 local_48 [12];
  undefined1 local_34 [8];
  InetAddress peerAddr;
  
  EventLoop::assertInLoopThread(this->m_loop);
  __addr_len = (socklen_t *)0x0;
  InetAddress::InetAddress((InetAddress *)local_34,0,false,false);
  iVar1 = Socket::accept(&this->m_acceptSocket,(int)(InetAddress *)local_34,__addr,__addr_len);
  if (iVar1 < 0) {
    Logger::SourceFile::SourceFile<99>
              ((SourceFile *)local_48,
               (char (*) [99])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Acceptor.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_48._0_8_;
    file.m_size = local_48._8_4_;
    Logger::Logger(&local_1018,file,0x50,false);
    LogStream::operator<<(&local_1018.m_impl.m_stream,"in Acceptor::handleRead");
    Logger::~Logger(&local_1018);
    iVar1 = sz_getlasterr();
    if (iVar1 == 0x18) {
      sockets::sz_closesocket(this->m_idleFd);
      iVar1 = accept((this->m_acceptSocket).m_sockfd,(sockaddr *)0x0,(socklen_t *)0x0);
      this->m_idleFd = iVar1;
      sockets::sz_closesocket(iVar1);
      iVar1 = createNullFileFd();
      this->m_idleFd = iVar1;
    }
  }
  else if ((this->m_newConnectionCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
    sockets::sz_closesocket(iVar1);
  }
  else {
    std::function<void_(int,_const_sznet::net::InetAddress_&)>::operator()
              (&this->m_newConnectionCallback,iVar1,(InetAddress *)local_34);
  }
  return;
}

Assistant:

void Acceptor::handleRead()
{
	m_loop->assertInLoopThread();
	InetAddress peerAddr;
	// FIXME loop until no more
	sockets::sz_sock connfd = m_acceptSocket.accept(&peerAddr);
	if (connfd >= 0)
	{
		// string hostport = peerAddr.toIpPort();
		// LOG_TRACE << "Accepts of " << hostport;
		if (m_newConnectionCallback)
		{
			m_newConnectionCallback(connfd, peerAddr);
		}
		else
		{
			// û�лص��������ر�client��Ӧ��fd
			sockets::sz_closesocket(connfd);
		}
	}
	// �����׽���ʧ��
	else
	{
		LOG_SYSERR << "in Acceptor::handleRead";
		// ���صĴ�����ΪEMFILE����������������
		if (sz_getlasterr() == sz_err_emfile)
		{
			// ��ֹbusy loop
			sockets::sz_closesocket(m_idleFd);
			m_idleFd = ::accept(m_acceptSocket.fd(), nullptr, nullptr);
			sockets::sz_closesocket(m_idleFd);
			m_idleFd = createNullFileFd();
		}
	}
}